

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httprpc.cpp
# Opt level: O2

bool StartHTTPRPC(any *context)

{
  long lVar1;
  HTTPRPCTimerInterface *pHVar2;
  unique_ptr<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_> uVar3;
  bool bVar4;
  int iVar5;
  optional<std::filesystem::perms> oVar6;
  size_type __n;
  size_type sVar7;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  Level in_ESI;
  _Optional_payload_base<std::filesystem::perms> cookie_perms;
  undefined8 uVar8;
  _Base_ptr p_Var9;
  HTTPRPCTimerInterface *pHVar10;
  _Alloc_hider this_00;
  long in_FS_OFFSET;
  string_view separators;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view str;
  string_view str_00;
  string_view source_file_04;
  string_view str_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Base_ptr local_138;
  size_t local_130;
  event_base *eventBase;
  undefined8 local_120 [3];
  bool local_108;
  string local_f8;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  whitelist_split;
  string local_98;
  string strWhitelist;
  anon_class_16_1_bc11688f handle_rpc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = LogAcceptCategory((LogFlags)context,in_ESI);
  if (bVar4) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
    ;
    source_file._M_len = 0x5b;
    logging_function._M_str = "StartHTTPRPC";
    logging_function._M_len = 0xc;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x169,RPC,Debug,(ConstevalFormatString<0U>)0xcd7dcc);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_158,"-rpcpassword",(allocator<char> *)&strWhitelist);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&handle_rpc,"",(allocator<char> *)&local_98);
  ArgsManager::GetArg((string *)&eventBase,&gArgs,(string *)local_158,(string *)&handle_rpc);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &eventBase,"");
  std::__cxx11::string::~string((string *)&eventBase);
  std::__cxx11::string::~string((string *)&handle_rpc);
  std::__cxx11::string::~string((string *)local_158);
  if (bVar4) {
    p_Var9 = (_Base_ptr)0xffffffffffffffff;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
    ;
    source_file_00._M_len = 0x5b;
    logging_function_00._M_str = "InitRPCAuthentication";
    logging_function_00._M_len = 0x15;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x129,ALL,Info,(ConstevalFormatString<0U>)0xcd7e95
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_158,"-rpccookieperms",(allocator<char> *)&handle_rpc);
    ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&eventBase,&gArgs,(string *)local_158);
    std::__cxx11::string::~string((string *)local_158);
    if (local_108 == true) {
      oVar6 = InterpretPermString((string *)&eventBase);
      if (((ulong)oVar6.super__Optional_base<std::filesystem::perms,_true,_true>._M_payload.
                  super__Optional_payload_base<std::filesystem::perms> >> 0x20 & 1) != 0) {
        cookie_perms = (_Optional_payload_base<std::filesystem::perms>)
                       ((ulong)oVar6.super__Optional_base<std::filesystem::perms,_true,_true>.
                               _M_payload.super__Optional_payload_base<std::filesystem::perms> &
                       0x1ffffffff);
        goto LAB_008df8cb;
      }
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
      ;
      source_file_01._M_len = 0x5b;
      logging_function_01._M_str = "InitRPCAuthentication";
      logging_function_01._M_len = 0x15;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_01,source_file_01,0x130,ALL,Info,
                 (ConstevalFormatString<1U>)0xcd7eca,(string *)&eventBase);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&eventBase);
    }
    else {
      cookie_perms._M_payload = (_Storage<std::filesystem::perms,_true>)0x0;
      cookie_perms._M_engaged = false;
      cookie_perms._5_3_ = 0;
LAB_008df8cb:
      bVar4 = GenerateAuthCookie(&strRPCUserColonPass_abi_cxx11_,
                                 (optional<std::filesystem::perms>)cookie_perms);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&eventBase);
      if (bVar4) goto LAB_008df8eb;
    }
LAB_008dfac6:
    bVar4 = false;
  }
  else {
    p_Var9 = (_Base_ptr)0xffffffffffffffff;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
    ;
    source_file_02._M_len = 0x5b;
    logging_function_02._M_str = "InitRPCAuthentication";
    logging_function_02._M_len = 0x15;
    LogPrintFormatInternal<>
              (logging_function_02,source_file_02,0x13a,ALL,Info,(ConstevalFormatString<0U>)0xcd7f12
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&strWhitelist,"-rpcuser",&local_159);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_15a);
    ArgsManager::GetArg((string *)&handle_rpc,&gArgs,&strWhitelist,&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle_rpc,
                   ":");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"-rpcpassword",&local_15b);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_15c);
    ArgsManager::GetArg((string *)&whitelist_split,&gArgs,&local_d8,&local_f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eventBase,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &whitelist_split);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&strRPCUserColonPass_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&eventBase);
    std::__cxx11::string::~string((string *)&eventBase);
    std::__cxx11::string::~string((string *)&whitelist_split);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&handle_rpc);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&strWhitelist);
LAB_008df8eb:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&eventBase,"-rpcauth",(allocator<char> *)&handle_rpc);
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_158,&gArgs,(string *)&eventBase);
    uVar8 = local_158._0_8_;
    pHVar2 = (HTTPRPCTimerInterface *)CONCAT44(local_158._12_4_,local_158._8_4_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_158);
    std::__cxx11::string::~string((string *)&eventBase);
    if ((HTTPRPCTimerInterface *)uVar8 != pHVar2) {
      p_Var9 = (_Base_ptr)0xffffffffffffffff;
      uVar8 = 0x13f;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
      ;
      source_file_03._M_len = 0x5b;
      logging_function_03._M_str = "InitRPCAuthentication";
      logging_function_03._M_len = 0x15;
      LogPrintFormatInternal<>
                (logging_function_03,source_file_03,0x13f,ALL,Info,
                 (ConstevalFormatString<0U>)0xcd7fff);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&eventBase,"-rpcauth",(allocator<char> *)&handle_rpc);
      ArgsManager::GetArgs
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_158,&gArgs,(string *)&eventBase);
      std::__cxx11::string::~string((string *)&eventBase);
      pHVar2 = (HTTPRPCTimerInterface *)CONCAT44(local_158._12_4_,local_158._8_4_);
      for (pHVar10 = (HTTPRPCTimerInterface *)local_158._0_8_; pHVar10 != pHVar2;
          pHVar10 = pHVar10 + 2) {
        str._M_str = (char *)0x3a;
        str._M_len = (size_t)(pHVar10->super_RPCTimerInterface)._vptr_RPCTimerInterface;
        util::SplitString_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&eventBase,(util *)pHVar10->base,str,(char)uVar8);
        str_00._M_str = (char *)0x24;
        str_00._M_len =
             (size_t)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_120[0] - 0x20))->_M_dataplus)._M_p;
        util::SplitString_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&handle_rpc,*(util **)(local_120[0] - 0x18),str_00,(char)uVar8);
        if ((local_120[0] - (long)eventBase != 0x40) ||
           ((long)handle_rpc.context._M_storage._M_ptr - (long)handle_rpc.context._M_manager != 0x40
           )) {
          source_file_04._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
          ;
          source_file_04._M_len = 0x5b;
          logging_function_04._M_str = "InitRPCAuthentication";
          logging_function_04._M_len = 0x15;
          LogPrintFormatInternal<>
                    (logging_function_04,source_file_04,0x148,ALL,Info,
                     (ConstevalFormatString<0U>)0xcd801e);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&handle_rpc);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&eventBase);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_158);
          goto LAB_008dfac6;
        }
        local_120[0] = local_120[0] - 0x20;
        std::__cxx11::string::~string((string *)local_120[0]);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&eventBase,
                   (const_iterator)local_120[0],
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )handle_rpc.context._M_manager,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )handle_rpc.context._M_storage);
        std::
        vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::push_back(&g_rpcauth_abi_cxx11_,(value_type *)&eventBase);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&handle_rpc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&eventBase);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_158);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&eventBase,"-rpcwhitelistdefault",(allocator<char> *)&handle_rpc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_158,"-rpcwhitelist",(allocator<char> *)&strWhitelist);
    bVar4 = ArgsManager::IsArgSet(&gArgs,(string *)local_158);
    g_rpc_whitelist_default = ArgsManager::GetBoolArg(&gArgs,(string *)&eventBase,bVar4);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&eventBase);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&eventBase,"-rpcwhitelist",(allocator<char> *)local_158);
    ArgsManager::GetArgs
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_98,&gArgs,(string *)&eventBase);
    std::__cxx11::string::~string((string *)&eventBase);
    for (this_00._M_p = local_98._M_dataplus._M_p;
        this_00._M_p != (pointer)local_98._M_string_length; this_00._M_p = this_00._M_p + 0x20) {
      __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       this_00._M_p,':',0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&handle_rpc,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_p,0
                 ,__n);
      sVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::count(&g_rpc_whitelist_abi_cxx11_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &handle_rpc);
      this = &std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](&g_rpc_whitelist_abi_cxx11_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &handle_rpc)->_M_t;
      if (__n != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&strWhitelist,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00._M_p
                   ,__n + 1,0xffffffffffffffff);
        separators._M_str = (char *)p_Var9;
        separators._M_len = (size_t)", ";
        str_01._M_str = (char *)0x2;
        str_01._M_len = (size_t)strWhitelist._M_dataplus._M_p;
        util::SplitString_abi_cxx11_
                  (&whitelist_split,(util *)strWhitelist._M_string_length,str_01,separators);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        set<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&eventBase,
                   (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )whitelist_split.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    )whitelist_split.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        if (sVar7 != 0) {
          local_158._8_4_ = _S_red;
          local_148._M_allocated_capacity = 0;
          p_Var9 = (_Base_ptr)(local_158 + 8);
          local_130 = 0;
          local_148._8_8_ = p_Var9;
          local_138 = p_Var9;
          std::
          __set_intersection<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::_Rb_tree_const_iterator<std::__cxx11::string>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_120[2],local_120,(this->_M_impl).super__Rb_tree_header._M_header._M_left,
                     &(this->_M_impl).super__Rb_tree_header,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_158);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&eventBase,
                      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_158);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_158);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(this,(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&eventBase);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&eventBase);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&whitelist_split);
        std::__cxx11::string::~string((string *)&strWhitelist);
      }
      std::__cxx11::string::~string((string *)&handle_rpc);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98);
    std::any::any(&handle_rpc.context,context);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&eventBase,"/",(allocator<char> *)&strWhitelist);
    std::function<bool(HTTPRequest*,std::__cxx11::string_const&)>::
    function<StartHTTPRPC(std::any_const&)::__0&,void>
              ((function<bool(HTTPRequest*,std::__cxx11::string_const&)> *)local_158,&handle_rpc);
    RegisterHTTPHandler((string *)&eventBase,true,(HTTPRequestHandler *)local_158);
    std::_Function_base::~_Function_base((_Function_base *)local_158);
    std::__cxx11::string::~string((string *)&eventBase);
    iVar5 = (**g_wallet_init_interface->_vptr_WalletInitInterface)();
    if ((char)iVar5 != '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&eventBase,"/wallet/",(allocator<char> *)&strWhitelist);
      std::function<bool(HTTPRequest*,std::__cxx11::string_const&)>::
      function<StartHTTPRPC(std::any_const&)::__0&,void>
                ((function<bool(HTTPRequest*,std::__cxx11::string_const&)> *)local_158,&handle_rpc);
      RegisterHTTPHandler((string *)&eventBase,false,(HTTPRequestHandler *)local_158);
      std::_Function_base::~_Function_base((_Function_base *)local_158);
      std::__cxx11::string::~string((string *)&eventBase);
    }
    eventBase = EventBase();
    if (eventBase == (event_base *)0x0) {
      __assert_fail("eventBase",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/httprpc.cpp"
                    ,0x173,"bool StartHTTPRPC(const std::any &)");
    }
    std::make_unique<HTTPRPCTimerInterface,event_base*&>((event_base **)local_158);
    uVar8 = local_158._0_8_;
    uVar3 = httpRPCTimerInterface;
    local_158._0_8_ = (HTTPRPCTimerInterface *)0x0;
    httpRPCTimerInterface._M_t.
    super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>._M_t.
    super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>.
    super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl =
         (__uniq_ptr_data<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>,_true,_true>
          )(__uniq_ptr_data<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>,_true,_true>
            )uVar8;
    if ((__uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>)
        uVar3._M_t.
        super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>.
        _M_t.
        super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>
        .super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>)0x0) {
      (**(code **)(*(long *)uVar3._M_t.
                            super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>
                            .super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl + 8)
      )();
      if ((HTTPRPCTimerInterface *)local_158._0_8_ != (HTTPRPCTimerInterface *)0x0) {
        (**(code **)(*(long *)local_158._0_8_ + 8))();
      }
    }
    RPCSetTimerInterface
              ((RPCTimerInterface *)
               httpRPCTimerInterface._M_t.
               super___uniq_ptr_impl<HTTPRPCTimerInterface,_std::default_delete<HTTPRPCTimerInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_HTTPRPCTimerInterface_*,_std::default_delete<HTTPRPCTimerInterface>_>
               .super__Head_base<0UL,_HTTPRPCTimerInterface_*,_false>._M_head_impl);
    std::any::reset(&handle_rpc.context);
    bVar4 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool StartHTTPRPC(const std::any& context)
{
    LogDebug(BCLog::RPC, "Starting HTTP RPC server\n");
    if (!InitRPCAuthentication())
        return false;

    auto handle_rpc = [context](HTTPRequest* req, const std::string&) { return HTTPReq_JSONRPC(context, req); };
    RegisterHTTPHandler("/", true, handle_rpc);
    if (g_wallet_init_interface.HasWalletSupport()) {
        RegisterHTTPHandler("/wallet/", false, handle_rpc);
    }
    struct event_base* eventBase = EventBase();
    assert(eventBase);
    httpRPCTimerInterface = std::make_unique<HTTPRPCTimerInterface>(eventBase);
    RPCSetTimerInterface(httpRPCTimerInterface.get());
    return true;
}